

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecache.c
# Opt level: O2

void h2o_filecache_close_file(h2o_filecache_ref_t *ref)

{
  size_t *psVar1;
  
  psVar1 = &ref->_refcnt;
  *psVar1 = *psVar1 - 1;
  if (*psVar1 != 0) {
    return;
  }
  if ((ref->_lru).next == (st_h2o_linklist_t *)0x0) {
    if (ref->fd != -1) {
      close(ref->fd);
    }
    free(ref);
    return;
  }
  __assert_fail("!h2o_linklist_is_linked(&ref->_lru)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/common/filecache.c"
                ,0x8f,"void h2o_filecache_close_file(h2o_filecache_ref_t *)");
}

Assistant:

void h2o_filecache_close_file(h2o_filecache_ref_t *ref)
{
    if (--ref->_refcnt != 0)
        return;
    assert(!h2o_linklist_is_linked(&ref->_lru));
    if (ref->fd != -1) {
        close(ref->fd);
        ref->fd = -1;
    }
    free(ref);
}